

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void entity_move(entity *e,void *w,vec3 *delta_pos)

{
  block_id block;
  int iVar1;
  float fVar2;
  float fVar3;
  float difference_5;
  float difference_4;
  float difference_3;
  float difference_2;
  float difference_1;
  float difference;
  vec3 block_position;
  int z;
  int x;
  int y;
  int axis;
  vec3 *delta_pos_local;
  void *w_local;
  entity *e_local;
  
  for (x = 0; x < 3; x = x + 1) {
    fVar2 = roundf((e->box).min.y);
    for (z = (int)(fVar2 - 1.0); fVar2 = roundf((e->box).max.y), (float)z <= fVar2 + 1.0; z = z + 1)
    {
      fVar2 = roundf((e->box).min.x);
      for (block_position.z = (float)(int)(fVar2 - 1.0); fVar2 = (float)(int)block_position.z,
          fVar3 = roundf((e->box).max.x), fVar2 <= fVar3 + 1.0;
          block_position.z = (float)((int)block_position.z + 1)) {
        fVar2 = roundf((e->box).min.z);
        for (block_position.y = (float)(int)(fVar2 - 1.0); fVar2 = (float)(int)block_position.y,
            fVar3 = roundf((e->box).max.z), fVar2 <= fVar3 + 1.0;
            block_position.y = (float)((int)block_position.y + 1)) {
          block = world_get_block((world *)w,(int)block_position.z,z,(int)block_position.y);
          iVar1 = block_is_obstacle(block);
          if (iVar1 != 0) {
            difference_1 = (float)(int)block_position.z;
            difference = (float)z - 0.5;
            block_position.x = (float)(int)block_position.y;
            bounding_box_update(&block_box,(vec3 *)&difference_1);
            if (x == 0) {
              if (((((e->box).min.z < block_box.max.z) && (block_box.min.z < (e->box).max.z)) &&
                  ((e->box).min.x < block_box.max.x)) && (block_box.min.x < (e->box).max.x)) {
                if (((0.0 < delta_pos->y) && ((e->box).max.y <= block_box.min.y)) &&
                   (fVar2 = block_box.min.y - (e->box).max.y, fVar2 < delta_pos->y)) {
                  delta_pos->y = fVar2;
                }
                if (((delta_pos->y <= 0.0 && delta_pos->y != 0.0) &&
                    (block_box.max.y <= (e->box).min.y)) &&
                   (fVar2 = block_box.max.y - (e->box).min.y,
                   delta_pos->y <= fVar2 && fVar2 != delta_pos->y)) {
                  delta_pos->y = fVar2;
                }
              }
            }
            else if (x == 1) {
              if (((((e->box).min.z < block_box.max.z) && (block_box.min.z < (e->box).max.z)) &&
                  ((e->box).min.y < block_box.max.y)) && (block_box.min.y < (e->box).max.y)) {
                if (((0.0 < delta_pos->x) && ((e->box).max.x <= block_box.min.x)) &&
                   (fVar2 = block_box.min.x - (e->box).max.x, fVar2 < delta_pos->x)) {
                  delta_pos->x = fVar2;
                }
                if (((delta_pos->x <= 0.0 && delta_pos->x != 0.0) &&
                    (block_box.max.x <= (e->box).min.x)) &&
                   (fVar2 = block_box.max.x - (e->box).min.x,
                   delta_pos->x <= fVar2 && fVar2 != delta_pos->x)) {
                  delta_pos->x = fVar2;
                }
              }
            }
            else if (((((e->box).min.x < block_box.max.x) && (block_box.min.x < (e->box).max.x)) &&
                     ((e->box).min.y < block_box.max.y)) && (block_box.min.y < (e->box).max.y)) {
              if (((0.0 < delta_pos->z) && ((e->box).max.z <= block_box.min.z)) &&
                 (fVar2 = block_box.min.z - (e->box).max.z, fVar2 < delta_pos->z)) {
                delta_pos->z = fVar2;
              }
              if (((delta_pos->z <= 0.0 && delta_pos->z != 0.0) &&
                  (block_box.max.z <= (e->box).min.z)) &&
                 (fVar2 = block_box.max.z - (e->box).min.z,
                 delta_pos->z <= fVar2 && fVar2 != delta_pos->z)) {
                delta_pos->z = fVar2;
              }
            }
          }
        }
      }
    }
    if (x == 0) {
      (e->box).min.y = delta_pos->y + (e->box).min.y;
      (e->box).max.y = delta_pos->y + (e->box).max.y;
    }
    else if (x == 1) {
      (e->box).min.x = delta_pos->x + (e->box).min.x;
      (e->box).max.x = delta_pos->x + (e->box).max.x;
    }
  }
  add_v3(&e->position,&e->position,delta_pos);
  return;
}

Assistant:

void entity_move(entity *e, void *w, vec3 *delta_pos)
{
    for (int axis = 0; axis < 3; axis++)
    {
        for (int y = roundf(e->box.min.y) - 1; y <= roundf(e->box.max.y) + 1; y++)
        {
            for (int x = roundf(e->box.min.x) - 1; x <= roundf(e->box.max.x) + 1; x++)
            {
                for (int z = roundf(e->box.min.z) - 1; z <= roundf(e->box.max.z) + 1; z++)
                {
                    if (!block_is_obstacle(world_get_block(w, x, y, z)))
                        continue;

                    vec3 block_position = {x, y - 0.5f, z};
                    bounding_box_update(&block_box, &block_position);

                    if (axis == 0)
                    {
                        if (e->box.min.z < block_box.max.z && e->box.max.z > block_box.min.z && e->box.min.x < block_box.max.x && e->box.max.x > block_box.min.x)
                        {
                            if (delta_pos->y > 0.0f && e->box.max.y <= block_box.min.y)
                            {
                                float difference = block_box.min.y - e->box.max.y;
                                if (difference < delta_pos->y)
                                    delta_pos->y = difference;
                            }
                            if (delta_pos->y < 0.0f && e->box.min.y >= block_box.max.y)
                            {
                                float difference = block_box.max.y - e->box.min.y;
                                if (difference > delta_pos->y)
                                    delta_pos->y = difference;
                            }
                        }
                    }
                    else if (axis == 1)
                    {
                        if (e->box.min.z < block_box.max.z && e->box.max.z > block_box.min.z && e->box.min.y < block_box.max.y && e->box.max.y > block_box.min.y)
                        {
                            if (delta_pos->x > 0.0f && e->box.max.x <= block_box.min.x)
                            {
                                float difference = block_box.min.x - e->box.max.x;
                                if (difference < delta_pos->x)
                                    delta_pos->x = difference;
                            }
                            if (delta_pos->x < 0.0f && e->box.min.x >= block_box.max.x)
                            {
                                float difference = block_box.max.x - e->box.min.x;
                                if (difference > delta_pos->x)
                                    delta_pos->x = difference;
                            }
                        }
                    }
                    else
                    {
                        if (e->box.min.x < block_box.max.x && e->box.max.x > block_box.min.x && e->box.min.y < block_box.max.y && e->box.max.y > block_box.min.y)
                        {
                            if (delta_pos->z > 0.0f && e->box.max.z <= block_box.min.z)
                            {
                                float difference = block_box.min.z - e->box.max.z;
                                if (difference < delta_pos->z)
                                    delta_pos->z = difference;
                            }
                            if (delta_pos->z < 0.0f && e->box.min.z >= block_box.max.z)
                            {
                                float difference = block_box.max.z - e->box.min.z;
                                if (difference > delta_pos->z)
                                    delta_pos->z = difference;
                            }
                        }
                    }
                }
            }
        }
        if (axis == 0)
        {
            e->box.min.y += delta_pos->y;
            e->box.max.y += delta_pos->y;
        }
        else if (axis == 1)
        {
            e->box.min.x += delta_pos->x;
            e->box.max.x += delta_pos->x;
        }
    }

    add_v3(&e->position, &e->position, delta_pos);
}